

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O3

CURLcode smb_send_and_recv(Curl_easy *data,void **msg)

{
  int *piVar1;
  size_t *psVar2;
  connectdata *pcVar3;
  connectdata *pcVar4;
  long lVar5;
  size_t sVar6;
  void *pvVar7;
  uint uVar8;
  unsigned_short uVar9;
  CURLcode CVar10;
  size_t in_RAX;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  size_t len;
  size_t nread;
  size_t local_38;
  
  pcVar3 = data->conn;
  *msg = (void *)0x0;
  local_38 = in_RAX;
  if ((pcVar3->proto).ftpc.pp.response.tv_sec == 0) {
    uVar11 = (pcVar3->proto).smbc.upload_size;
    if (uVar11 == 0) goto LAB_00607e1e;
    local_38 = (size_t)(data->set).upload_buffer_size;
    if (uVar11 < local_38) {
      local_38 = uVar11;
    }
    (data->req).upload_fromhere = (data->state).ulbuf;
    CVar10 = Curl_fillreadbuffer(data,local_38,&local_38);
    if ((CVar10 != CURLE_AGAIN) && (CVar10 != CURLE_OK)) {
      return CVar10;
    }
    if (local_38 == 0) {
      return CURLE_OK;
    }
    psVar2 = &(pcVar3->proto).ftpc.pp.sendsize;
    *psVar2 = *psVar2 - local_38;
    (pcVar3->proto).smbc.send_size = local_38;
    *(undefined8 *)&(pcVar3->proto).ftpc.pp.response.tv_usec = 0;
  }
  pcVar4 = data->conn;
  lVar5 = (pcVar4->proto).ftpc.pp.response.tv_sec;
  if (lVar5 != 0) {
    sVar6 = (pcVar4->proto).smbc.sent;
    len = lVar5 - sVar6;
    CVar10 = Curl_write(data,pcVar4->sock[0],(data->state).ulbuf + sVar6,len,(ssize_t *)&local_38);
    if (CVar10 != CURLE_OK) {
      return CVar10;
    }
    if (local_38 == len) {
      (pcVar4->proto).ftpc.pp.response.tv_sec = 0;
    }
    else {
      piVar1 = &(pcVar4->proto).ftpc.pp.response.tv_usec;
      *(size_t *)piVar1 = *(long *)piVar1 + local_38;
    }
  }
  if ((pcVar3->proto).ftpc.pp.response.tv_sec != 0) {
    return CURLE_AGAIN;
  }
  if ((pcVar3->proto).ftpc.pp.sendsize != 0) {
    return CURLE_AGAIN;
  }
LAB_00607e1e:
  pcVar3 = data->conn;
  pvVar7 = (void *)(pcVar3->proto).ftpc.pp.sendleft;
  sVar6 = (pcVar3->proto).httpc.binlen;
  CVar10 = Curl_read(data,pcVar3->sock[0],(char *)(sVar6 + (long)pvVar7),0x9000 - sVar6,
                     (ssize_t *)&local_38);
  if (CVar10 != CURLE_OK) {
    return CVar10;
  }
  if (local_38 == 0) {
    return CURLE_OK;
  }
  uVar11 = local_38 + (pcVar3->proto).ftpc.pp.response_time;
  (pcVar3->proto).ftpc.pp.response_time = uVar11;
  if (uVar11 < 4) {
    return CURLE_OK;
  }
  uVar9 = Curl_read16_be((uchar *)((long)pvVar7 + 2));
  if ((ulong)uVar9 + 4 <= (ulong)(pcVar3->proto).ftpc.pp.response_time) {
    if (0x20 < uVar9) {
      uVar8 = (uint)*(byte *)((long)pvVar7 + 0x24) * 2;
      uVar12 = uVar8 + 0x27;
      uVar13 = (uint)((ulong)uVar9 + 4);
      if ((uVar12 <= uVar13) &&
         (uVar9 = Curl_read16_le((uchar *)((long)pvVar7 + (ulong)uVar8 + 0x25)),
         uVar13 < uVar12 + uVar9)) {
        return CURLE_READ_ERROR;
      }
    }
    *msg = pvVar7;
    return CURLE_OK;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode smb_send_and_recv(struct Curl_easy *data, void **msg)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;
  CURLcode result;
  *msg = NULL; /* if it returns early */

  /* Check if there is data in the transfer buffer */
  if(!smbc->send_size && smbc->upload_size) {
    size_t nread = smbc->upload_size > (size_t)data->set.upload_buffer_size ?
      (size_t)data->set.upload_buffer_size : smbc->upload_size;
    data->req.upload_fromhere = data->state.ulbuf;
    result = Curl_fillreadbuffer(data, nread, &nread);
    if(result && result != CURLE_AGAIN)
      return result;
    if(!nread)
      return CURLE_OK;

    smbc->upload_size -= nread;
    smbc->send_size = nread;
    smbc->sent = 0;
  }

  /* Check if there is data to send */
  if(smbc->send_size) {
    result = smb_flush(data);
    if(result)
      return result;
  }

  /* Check if there is still data to be sent */
  if(smbc->send_size || smbc->upload_size)
    return CURLE_AGAIN;

  return smb_recv_message(data, msg);
}